

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

void ScaKwdHdr(GmfMshSct *msh,int KwdCod)

{
  int iVar1;
  int iVar2;
  void *ptr;
  int64_t iVar3;
  int in_ESI;
  long in_RDI;
  KwdSct *kwd;
  int i;
  int in_stack_0000001c;
  GmfMshSct *in_stack_00000020;
  int in_stack_fffffffffffffff0;
  
  ptr = (void *)(in_RDI + 0x110 + (long)in_ESI * 0x3300);
  iVar1 = strcmp("i",GmfKwdFmt[in_ESI][1]);
  if (iVar1 == 0) {
    if ((*(uint *)(in_RDI + 0xc) & 1) == 0) {
      if (*(int *)(in_RDI + 4) < 4) {
        ScaWrd((GmfMshSct *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ptr);
        *(long *)((long)ptr + 0xfc8) = (long)in_stack_fffffffffffffff0;
      }
      else {
        ScaDblWrd((GmfMshSct *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ptr);
      }
    }
    else {
      iVar1 = __isoc99_fscanf(*(undefined8 *)(in_RDI + 0x300410),"%ld",(long)ptr + 0xfc8);
      if (iVar1 != 1) {
        longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-1);
      }
    }
  }
  else {
    *(undefined8 *)((long)ptr + 0xfc8) = 1;
  }
  iVar1 = strcmp("sr",GmfKwdFmt[in_ESI][2]);
  if ((iVar1 == 0) || (iVar1 = strcmp("hr",GmfKwdFmt[in_ESI][2]), iVar1 == 0)) {
    if ((*(uint *)(in_RDI + 0xc) & 1) == 0) {
      ScaWrd((GmfMshSct *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),ptr);
      for (iVar1 = 0; iVar1 < *(int *)((long)ptr + 0x14); iVar1 = iVar1 + 1) {
        ScaWrd((GmfMshSct *)CONCAT44(in_ESI,iVar1),ptr);
      }
      iVar2 = strcmp("hr",GmfKwdFmt[in_ESI][2]);
      if (iVar2 == 0) {
        ScaWrd((GmfMshSct *)CONCAT44(in_ESI,iVar1),ptr);
        ScaWrd((GmfMshSct *)CONCAT44(in_ESI,iVar1),ptr);
      }
      else {
        *(undefined4 *)((long)ptr + 4) = 0;
        *(undefined4 *)((long)ptr + 8) = 1;
      }
    }
    else {
      iVar1 = __isoc99_fscanf(*(undefined8 *)(in_RDI + 0x300410),"%d",(long)ptr + 0x14);
      if (iVar1 != 1) {
        longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-1);
      }
      for (iVar1 = 0; iVar1 < *(int *)((long)ptr + 0x14); iVar1 = iVar1 + 1) {
        iVar2 = __isoc99_fscanf(*(undefined8 *)(in_RDI + 0x300410),"%d",
                                (long)ptr + (long)iVar1 * 4 + 0x18);
        if (iVar2 != 1) {
          longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-1);
        }
      }
      iVar1 = strcmp("hr",GmfKwdFmt[in_ESI][2]);
      if (iVar1 == 0) {
        iVar1 = __isoc99_fscanf(*(undefined8 *)(in_RDI + 0x300410),"%d",(long)ptr + 4);
        if (iVar1 != 1) {
          longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-1);
        }
        iVar1 = __isoc99_fscanf(*(undefined8 *)(in_RDI + 0x300410),"%d",(long)ptr + 8);
        if (iVar1 != 1) {
          longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-1);
        }
      }
      else {
        *(undefined4 *)((long)ptr + 4) = 0;
        *(undefined4 *)((long)ptr + 8) = 1;
      }
    }
  }
  ExpFmt(in_stack_00000020,in_stack_0000001c);
  iVar3 = GetFilPos((GmfMshSct *)0x10fec5);
  *(int64_t *)((long)ptr + 0xfd0) = iVar3;
  return;
}

Assistant:

static void ScaKwdHdr(GmfMshSct *msh, int KwdCod)
{
   int      i;
   KwdSct   *kwd = &msh->KwdTab[ KwdCod ];

   if(!strcmp("i", GmfKwdFmt[ KwdCod ][1]))
      if(msh->typ & Asc)
         safe_fscanf(msh->hdl, INT64_T_FMT, &kwd->NmbLin, msh->err);
      else
         if(msh->ver <= 3)
         {
            ScaWrd(msh, (unsigned char *)&i);
            kwd->NmbLin = i;
         }
         else
            ScaDblWrd(msh, (unsigned char *)&kwd->NmbLin);
   else
      kwd->NmbLin = 1;

   if(!strcmp("sr", GmfKwdFmt[ KwdCod ][2])
   || !strcmp("hr", GmfKwdFmt[ KwdCod ][2]) )
   {
      if(msh->typ & Asc)
      {
         safe_fscanf(msh->hdl, "%d", &kwd->NmbTyp, msh->err);

         for(i=0;i<kwd->NmbTyp;i++)
            safe_fscanf(msh->hdl, "%d", &kwd->TypTab[i], msh->err);

         // Scan two extra fields for HO solutions: deg and nmb Nodes
         if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]))
         {
            safe_fscanf(msh->hdl, "%d", &kwd->deg, msh->err);
            safe_fscanf(msh->hdl, "%d", &kwd->NmbNod, msh->err);
         }
         else
         {
            kwd->deg = 0;
            kwd->NmbNod = 1;
         }

      }
      else
      {
         ScaWrd(msh, (unsigned char *)&kwd->NmbTyp);

         for(i=0;i<kwd->NmbTyp;i++)
            ScaWrd(msh, (unsigned char *)&kwd->TypTab[i]);

         // Scan two extra fields for HO solutions: deg and nmb Nodes
         if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]))
         {
            ScaWrd(msh, (unsigned char *)&kwd->deg);
            ScaWrd(msh, (unsigned char *)&kwd->NmbNod);
         }
         else
         {
            kwd->deg = 0;
            kwd->NmbNod = 1;
         }
      }
   }

   ExpFmt(msh, KwdCod);
   kwd->pos = GetFilPos(msh);
}